

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSRegExp * js_get_regexp(JSContext *ctx,JSValue obj,BOOL throw_error)

{
  int in_ECX;
  int in_EDX;
  JSContext *in_RSI;
  JSObject *p;
  undefined1 in_stack_ffffffffffffffc0 [16];
  JSContext *in_stack_ffffffffffffffd0;
  JSRegExp *local_8;
  
  if ((in_EDX == -1) && (in_stack_ffffffffffffffd0 = in_RSI, (in_RSI->header).dummy2 == 0x12)) {
    local_8 = (JSRegExp *)&in_RSI->binary_object_count;
  }
  else {
    if (in_ECX != 0) {
      JS_ThrowTypeErrorInvalidClass(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._12_4_);
    }
    local_8 = (JSRegExp *)0x0;
  }
  return local_8;
}

Assistant:

static JSRegExp *js_get_regexp(JSContext *ctx, JSValueConst obj, BOOL throw_error)
{
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(obj);
        if (p->class_id == JS_CLASS_REGEXP)
            return &p->u.regexp;
    }
    if (throw_error) {
        JS_ThrowTypeErrorInvalidClass(ctx, JS_CLASS_REGEXP);
    }
    return NULL;
}